

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_nblock(Integer g_a,Integer *nblock)

{
  short sVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  char err_string_1 [256];
  char err_string [256];
  int n;
  int i;
  Integer ga_handle;
  char acStackY_228 [256];
  char local_128 [160];
  Integer in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int local_1c;
  
  lVar2 = in_RDI + 1000;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_128,"%s: INVALID ARRAY HANDLE","ga_nblock");
    pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  if (GA[in_RDI + 1000].actv == 0) {
    sprintf(acStackY_228,"%s: ARRAY NOT ACTIVE","ga_nblock");
    pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  sVar1 = GA[lVar2].ndim;
  if (GA[lVar2].distr_type == 0) {
    for (local_1c = 0; local_1c < sVar1; local_1c = local_1c + 1) {
      *(long *)(in_RSI + (long)local_1c * 8) = (long)GA[lVar2].nblock[local_1c];
    }
  }
  else {
    for (local_1c = 0; local_1c < sVar1; local_1c = local_1c + 1) {
      *(C_Integer *)(in_RSI + (long)local_1c * 8) = GA[lVar2].num_blocks[local_1c];
    }
  }
  return;
}

Assistant:

void pnga_nblock(Integer g_a, Integer *nblock)
{
Integer ga_handle = GA_OFFSET + g_a;
int i, n;

     ga_check_handleM(g_a, "ga_nblock");

     n = GA[ga_handle].ndim;

     if (GA[ga_handle].distr_type == REGULAR) {
       for(i=0; i<n; i++) nblock[i] = (Integer)GA[ga_handle].nblock[i];
     } else {
       for(i=0; i<n; i++) nblock[i] = (Integer)GA[ga_handle].num_blocks[i];
     }
}